

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

void __thiscall wabt::WastParser::ErrorUnlessOpcodeEnabled(WastParser *this,Token *token)

{
  bool bVar1;
  Info local_70;
  char *local_48;
  size_type sStack_40;
  size_t local_38;
  undefined8 uStack_30;
  Opcode local_1c [2];
  Opcode opcode;
  
  if (token->token_type_ - AtomicLoad < 0x34) {
    local_1c[0].enum_ = (token->field_2).type_;
    bVar1 = Opcode::IsEnabled(local_1c,&this->options_->features);
    if (!bVar1) {
      local_48 = (token->loc).filename.data_;
      sStack_40 = (token->loc).filename.size_;
      local_38 = (token->loc).field_1.field_1.offset;
      uStack_30 = *(undefined8 *)((long)&(token->loc).field_1 + 8);
      Opcode::GetInfo(&local_70,local_1c);
      Error(this,0x11d8a24,local_70.name);
    }
    return;
  }
  __assert_fail("HasOpcode()",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/token.h"
                ,0x6b,"Opcode wabt::Token::opcode() const");
}

Assistant:

void WastParser::ErrorUnlessOpcodeEnabled(const Token& token) {
  Opcode opcode = token.opcode();
  if (!opcode.IsEnabled(options_->features)) {
    Error(token.loc, "opcode not allowed: %s", opcode.GetName());
  }
}